

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

size_t ZSTD_decompressBlock(ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t sVar1;
  
  ZSTD_checkContinuity(dctx,dst,dstCapacity);
  sVar1 = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,0);
  dctx->previousDstEnd = (void *)((long)dst + sVar1);
  return sVar1;
}

Assistant:

size_t ZSTD_decompressBlock(ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    size_t dSize;
    ZSTD_checkContinuity(dctx, dst, dstCapacity);
    dSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 0);
    dctx->previousDstEnd = (char*)dst + dSize;
    return dSize;
}